

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3Vacuum(Parse *pParse,Token *pNm)

{
  uint p1;
  uint uVar1;
  Vdbe *p;
  Token *local_28;
  
  p = pParse->pVdbe;
  local_28 = pNm;
  if (p == (Vdbe *)0x0) {
    p = allocVdbe(pParse);
  }
  if (pNm == (Token *)0x0) {
    p1 = 0;
  }
  else {
    p1 = sqlite3TwoPartName(pParse,pNm,pNm,&local_28);
  }
  if ((p != (Vdbe *)0x0) && (1 < (int)p1 || p1 == 0)) {
    sqlite3VdbeAddOp3(p,10,p1,0,0);
    uVar1 = 1 << ((byte)p1 & 0x1f);
    p->btreeMask = p->btreeMask | uVar1;
    if ((p1 != 1) && ((p->db->aDb[p1].pBt)->sharable != '\0')) {
      p->lockMask = p->lockMask | uVar1;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Vacuum(Parse *pParse, Token *pNm){
  Vdbe *v = sqlite3GetVdbe(pParse);
  int iDb = pNm ? sqlite3TwoPartName(pParse, pNm, pNm, &pNm) : 0;
  if( v && (iDb>=2 || iDb==0) ){
    sqlite3VdbeAddOp1(v, OP_Vacuum, iDb);
    sqlite3VdbeUsesBtree(v, iDb);
  }
  return;
}